

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void qt_painterpath_isect_line(QPointF *p1,QPointF *p2,QPointF *pos,int *winding)

{
  bool bVar1;
  int *in_RCX;
  QPointF *in_RDX;
  QPointF *in_RSI;
  QPointF *in_RDI;
  qreal qVar2;
  qreal qVar3;
  qreal p1_00;
  qreal x;
  qreal y_tmp;
  qreal x_tmp;
  int dir;
  qreal y;
  qreal y2;
  qreal x2;
  qreal y1;
  qreal x1;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_28 = QPointF::x(in_RDI);
  local_30 = QPointF::y(in_RDI);
  qVar2 = QPointF::x(in_RSI);
  qVar3 = QPointF::y(in_RSI);
  p1_00 = QPointF::y(in_RDX);
  iVar4 = 1;
  bVar1 = qFuzzyCompare(p1_00,(double)CONCAT44(1,in_stack_ffffffffffffffb0));
  if (!bVar1) {
    local_40 = qVar3;
    local_38 = qVar2;
    if (qVar3 < local_30) {
      iVar4 = -1;
      local_40 = local_30;
      local_38 = local_28;
      local_30 = qVar3;
      local_28 = qVar2;
    }
    if (((local_30 <= p1_00) && (p1_00 < local_40)) &&
       (qVar2 = QPointF::x(in_RDX),
       ((local_38 - local_28) / (local_40 - local_30)) * (p1_00 - local_30) + local_28 <= qVar2)) {
      *in_RCX = iVar4 + *in_RCX;
    }
  }
  return;
}

Assistant:

static void qt_painterpath_isect_line(const QPointF &p1,
                                      const QPointF &p2,
                                      const QPointF &pos,
                                      int *winding)
{
    qreal x1 = p1.x();
    qreal y1 = p1.y();
    qreal x2 = p2.x();
    qreal y2 = p2.y();
    qreal y = pos.y();

    int dir = 1;

    if (qFuzzyCompare(y1, y2)) {
        // ignore horizontal lines according to scan conversion rule
        return;
    } else if (y2 < y1) {
        qreal x_tmp = x2; x2 = x1; x1 = x_tmp;
        qreal y_tmp = y2; y2 = y1; y1 = y_tmp;
        dir = -1;
    }

    if (y >= y1 && y < y2) {
        qreal x = x1 + ((x2 - x1) / (y2 - y1)) * (y - y1);

        // count up the winding number if we're
        if (x<=pos.x()) {
            (*winding) += dir;
        }
    }
}